

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_26::UnknownFieldHandlerLite::Varint
               (MessageLite *msg,ParseTable *table,int tag,int value)

{
  LogMessage *other;
  string *target;
  undefined1 local_d0 [8];
  CodedOutputStream unknown_fields_stream;
  StringOutputStream unknown_fields_string;
  LogMessage local_58;
  uint32 local_20;
  uint32 local_1c;
  int value_local;
  int tag_local;
  ParseTable *table_local;
  MessageLite *msg_local;
  
  local_20 = value;
  local_1c = tag;
  _value_local = table;
  table_local = (ParseTable *)msg;
  if ((table->unknown_field_set & 1U) != 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "third_party/protobuf-lite/generated_message_table_driven_lite.cc",0x45);
    other = LogMessage::operator<<(&local_58,"CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)((long)&unknown_fields_string.target_ + 3),other);
    LogMessage::~LogMessage(&local_58);
  }
  target = (anonymous_namespace)::MutableUnknownFields_abi_cxx11_
                     ((MessageLite *)table_local,_value_local->arena_offset);
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)&unknown_fields_stream.start_count_,target);
  io::CodedOutputStream::CodedOutputStream
            ((CodedOutputStream *)local_d0,
             (ZeroCopyOutputStream *)&unknown_fields_stream.start_count_,false);
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)local_d0,local_1c);
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)local_d0,local_20);
  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_d0);
  io::StringOutputStream::~StringOutputStream
            ((StringOutputStream *)&unknown_fields_stream.start_count_);
  return;
}

Assistant:

static void Varint(MessageLite* msg, const ParseTable& table, int tag,
                     int value) {
    GOOGLE_DCHECK(!table.unknown_field_set);

    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    unknown_fields_stream.WriteVarint32(tag);
    unknown_fields_stream.WriteVarint32(value);
  }